

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O3

void DUI_Panel(int width,int height)

{
  SDL_Point SVar1;
  SDL_Point local_18;
  int local_10;
  int local_c;
  
  local_18 = _duiCursor;
  local_10 = width;
  local_c = height;
  SDL_SetRenderDrawColor
            (_duiRenderer,_duiStyle.ColorBackground[0],_duiStyle.ColorBackground[1],
             _duiStyle.ColorBackground[2],_duiStyle.ColorBackground[3]);
  SDL_RenderFillRect(_duiRenderer,&local_18);
  SDL_SetRenderDrawColor
            (_duiRenderer,_duiStyle.ColorBorder[0],_duiStyle.ColorBorder[1],_duiStyle.ColorBorder[2]
             ,_duiStyle.ColorBorder[3]);
  SDL_RenderDrawRect(_duiRenderer,&local_18);
  SVar1.x = _duiStyle.PanelPadding + _duiCursor.x;
  SVar1.y = _duiStyle.PanelPadding + _duiCursor.y;
  _duiCursor = SVar1;
  _duiLineStart = SVar1.x;
  return;
}

Assistant:

void DUI_Panel(int width, int height)
{
    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    DUI_setColorBackground();
    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    DUI_MoveCursorRelative(_duiStyle.PanelPadding, _duiStyle.PanelPadding);
}